

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  int *in_R8;
  bool bVar4;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  uint highest;
  size_t i;
  uint num_channels;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  uchar *in_stack_ffffffffffffffa8;
  uchar *bitstream;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  long local_38;
  byte *local_8;
  
  uVar3 = 3;
  if (in_EDX != 0) {
    uVar3 = 4;
  }
  local_8 = in_RDI;
  if (*in_R8 == 0) {
    if (in_R8[1] == 8) {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        bVar2 = *(byte *)(in_RCX + local_38);
        local_8[2] = bVar2;
        local_8[1] = bVar2;
        *local_8 = bVar2;
        if (in_EDX != 0) {
          bVar4 = false;
          if (in_R8[6] != 0) {
            bVar4 = (uint)*(byte *)(in_RCX + local_38) == in_R8[7];
          }
          bVar2 = 0xff;
          if (bVar4) {
            bVar2 = 0;
          }
          local_8[3] = bVar2;
        }
        local_8 = local_8 + uVar3;
      }
    }
    else if (in_R8[1] == 0x10) {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        bVar2 = *(byte *)(in_RCX + local_38 * 2);
        local_8[2] = bVar2;
        local_8[1] = bVar2;
        *local_8 = bVar2;
        if (in_EDX != 0) {
          bVar4 = false;
          if (in_R8[6] != 0) {
            bVar4 = (uint)*(byte *)(in_RCX + local_38 * 2) * 0x100 +
                    (uint)*(byte *)(in_RCX + 1 + local_38 * 2) == in_R8[7];
          }
          bVar2 = 0xff;
          if (bVar4) {
            bVar2 = 0;
          }
          local_8[3] = bVar2;
        }
        local_8 = local_8 + uVar3;
      }
    }
    else {
      iVar1 = in_R8[1];
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        in_stack_ffffffffffffffb4 =
             readBitsFromReversedStream
                       ((size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8,
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,
                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                   CONCAT14(in_stack_ffffffffffffffa4,
                                                            in_stack_ffffffffffffffa0)))));
        bVar2 = (byte)((in_stack_ffffffffffffffb4 * 0xff) / ((1 << ((byte)iVar1 & 0x1f)) - 1U));
        local_8[2] = bVar2;
        local_8[1] = bVar2;
        *local_8 = bVar2;
        if (in_EDX != 0) {
          in_stack_ffffffffffffffa5 = false;
          if (in_R8[6] != 0) {
            in_stack_ffffffffffffffa5 = in_stack_ffffffffffffffb4 == in_R8[7];
          }
          bVar2 = 0xff;
          if ((bool)in_stack_ffffffffffffffa5 != false) {
            bVar2 = 0;
          }
          local_8[3] = bVar2;
        }
        local_8 = local_8 + uVar3;
      }
    }
  }
  else if (*in_R8 == 2) {
    if (in_R8[1] == 8) {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        *local_8 = *(byte *)(in_RCX + local_38 * 3);
        local_8[1] = *(byte *)(in_RCX + 1 + local_38 * 3);
        local_8[2] = *(byte *)(in_RCX + 2 + local_38 * 3);
        if (in_EDX != 0) {
          bVar4 = false;
          if (((in_R8[6] != 0) && (bVar4 = false, (uint)*local_8 == in_R8[7])) &&
             (bVar4 = false, (uint)local_8[1] == in_R8[8])) {
            bVar4 = (uint)local_8[2] == in_R8[9];
          }
          bVar2 = 0xff;
          if (bVar4) {
            bVar2 = 0;
          }
          local_8[3] = bVar2;
        }
        local_8 = local_8 + uVar3;
      }
    }
    else {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        *local_8 = *(byte *)(in_RCX + local_38 * 6);
        local_8[1] = *(byte *)(in_RCX + 2 + local_38 * 6);
        local_8[2] = *(byte *)(in_RCX + 4 + local_38 * 6);
        if (in_EDX != 0) {
          bVar4 = false;
          if (((in_R8[6] != 0) &&
              (bVar4 = false,
              (uint)*(byte *)(in_RCX + local_38 * 6) * 0x100 +
              (uint)*(byte *)(in_RCX + 1 + local_38 * 6) == in_R8[7])) &&
             (bVar4 = false,
             (uint)*(byte *)(in_RCX + 2 + local_38 * 6) * 0x100 +
             (uint)*(byte *)(in_RCX + 3 + local_38 * 6) == in_R8[8])) {
            bVar4 = (uint)*(byte *)(in_RCX + 4 + local_38 * 6) * 0x100 +
                    (uint)*(byte *)(in_RCX + 5 + local_38 * 6) == in_R8[9];
          }
          bVar2 = 0xff;
          if (bVar4) {
            bVar2 = 0;
          }
          local_8[3] = bVar2;
        }
        local_8 = local_8 + uVar3;
      }
    }
  }
  else if (*in_R8 == 3) {
    bitstream = (uchar *)0x0;
    for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
      if (in_R8[1] == 8) {
        in_stack_ffffffffffffffb0 = (uint)*(byte *)(in_RCX + local_38);
      }
      else {
        in_stack_ffffffffffffffb0 =
             readBitsFromReversedStream
                       ((size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        bitstream,
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,
                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                   CONCAT14(in_stack_ffffffffffffffa4,
                                                            in_stack_ffffffffffffffa0)))));
      }
      if ((ulong)in_stack_ffffffffffffffb0 < *(ulong *)(in_R8 + 4)) {
        *local_8 = *(byte *)(*(long *)(in_R8 + 2) + (ulong)(in_stack_ffffffffffffffb0 << 2));
        local_8[1] = *(byte *)(*(long *)(in_R8 + 2) + (ulong)(in_stack_ffffffffffffffb0 * 4 + 1));
        local_8[2] = *(byte *)(*(long *)(in_R8 + 2) + (ulong)(in_stack_ffffffffffffffb0 * 4 + 2));
        if (in_EDX != 0) {
          local_8[3] = *(byte *)(*(long *)(in_R8 + 2) + (ulong)(in_stack_ffffffffffffffb0 * 4 + 3));
        }
      }
      else {
        local_8[2] = 0;
        local_8[1] = 0;
        *local_8 = 0;
        if (in_EDX != 0) {
          local_8[3] = 0xff;
        }
      }
      local_8 = local_8 + uVar3;
    }
  }
  else if (*in_R8 == 4) {
    if (in_R8[1] == 8) {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        bVar2 = *(byte *)(in_RCX + local_38 * 2);
        local_8[2] = bVar2;
        local_8[1] = bVar2;
        *local_8 = bVar2;
        if (in_EDX != 0) {
          local_8[3] = *(byte *)(in_RCX + 1 + local_38 * 2);
        }
        local_8 = local_8 + uVar3;
      }
    }
    else {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        bVar2 = *(byte *)(in_RCX + local_38 * 4);
        local_8[2] = bVar2;
        local_8[1] = bVar2;
        *local_8 = bVar2;
        if (in_EDX != 0) {
          local_8[3] = *(byte *)(in_RCX + 2 + local_38 * 4);
        }
        local_8 = local_8 + uVar3;
      }
    }
  }
  else if (*in_R8 == 6) {
    if (in_R8[1] == 8) {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        *local_8 = *(byte *)(in_RCX + local_38 * 4);
        local_8[1] = *(byte *)(in_RCX + 1 + local_38 * 4);
        local_8[2] = *(byte *)(in_RCX + 2 + local_38 * 4);
        if (in_EDX != 0) {
          local_8[3] = *(byte *)(in_RCX + 3 + local_38 * 4);
        }
        local_8 = local_8 + uVar3;
      }
    }
    else {
      for (local_38 = 0; local_38 != in_RSI; local_38 = local_38 + 1) {
        *local_8 = *(byte *)(in_RCX + local_38 * 8);
        local_8[1] = *(byte *)(in_RCX + 2 + local_38 * 8);
        local_8[2] = *(byte *)(in_RCX + 4 + local_38 * 8);
        if (in_EDX != 0) {
          local_8[3] = *(byte *)(in_RCX + 6 + local_38 * 8);
        }
        local_8 = local_8 + uVar3;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
	unsigned has_alpha, const unsigned char* in,
	const LodePNGColorMode* mode)
{
	unsigned num_channels = has_alpha ? 4 : 3;
	size_t i;
	if (mode->colortype == LCT_GREY)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i];
				if (has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
			}
		}
		else if (mode->bitdepth == 16)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2];
				if (has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
			}
		}
		else
		{
			unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
			size_t j = 0;
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
				buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
				if (has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_RGB)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 3 + 0];
				buffer[1] = in[i * 3 + 1];
				buffer[2] = in[i * 3 + 2];
				if (has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
					&& buffer[1] == mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 6 + 0];
				buffer[1] = in[i * 6 + 2];
				buffer[2] = in[i * 6 + 4];
				if (has_alpha) buffer[3] = mode->key_defined
					&& 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
					&& 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
					&& 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_PALETTE)
	{
		unsigned index;
		size_t j = 0;
		for (i = 0; i != numpixels; ++i, buffer += num_channels)
		{
			if (mode->bitdepth == 8) index = in[i];
			else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

			if (index >= mode->palettesize)
			{
				/*This is an error according to the PNG spec, but most PNG decoders make it black instead.
				Done here too, slightly faster due to no error handling needed.*/
				buffer[0] = buffer[1] = buffer[2] = 0;
				if (has_alpha) buffer[3] = 255;
			}
			else
			{
				buffer[0] = mode->palette[index * 4 + 0];
				buffer[1] = mode->palette[index * 4 + 1];
				buffer[2] = mode->palette[index * 4 + 2];
				if (has_alpha) buffer[3] = mode->palette[index * 4 + 3];
			}
		}
	}
	else if (mode->colortype == LCT_GREY_ALPHA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
				if (has_alpha) buffer[3] = in[i * 2 + 1];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
				if (has_alpha) buffer[3] = in[i * 4 + 2];
			}
		}
	}
	else if (mode->colortype == LCT_RGBA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 4 + 0];
				buffer[1] = in[i * 4 + 1];
				buffer[2] = in[i * 4 + 2];
				if (has_alpha) buffer[3] = in[i * 4 + 3];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 8 + 0];
				buffer[1] = in[i * 8 + 2];
				buffer[2] = in[i * 8 + 4];
				if (has_alpha) buffer[3] = in[i * 8 + 6];
			}
		}
	}
}